

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_general.h
# Opt level: O0

Violation __thiscall
mp::SOS_1or2_Constraint<2>::
ComputeViolationSOS2<mp::VarInfoImpl<std::vector<double,std::allocator<double>>>>
          (SOS_1or2_Constraint<2> *this,
          VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *x)

{
  Violation VVar1;
  bool bVar2;
  size_type sVar3;
  int *piVar4;
  int iVar5;
  long in_RDI;
  int i;
  int posDist;
  int pos2;
  int pos1;
  int npos;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  
  local_24 = 0;
  local_28 = -1;
  local_2c = -1;
  local_30 = 1;
  sVar3 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20));
  local_34 = (int)sVar3;
  while (iVar5 = local_34 + -1, local_34 != 0) {
    local_34 = iVar5;
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20),(long)iVar5);
    bVar2 = VarInfoImpl<std::vector<double,_std::allocator<double>_>_>::is_positive
                      ((VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *)
                       CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       (int)((ulong)in_RDI >> 0x20));
    if (bVar2) {
      local_24 = local_24 + 1;
      if (local_28 < 0) {
        local_28 = local_34;
      }
      else if (local_2c < 0) {
        local_2c = local_34;
        local_30 = local_28 - local_34;
      }
    }
  }
  local_38 = 0;
  local_34 = iVar5;
  piVar4 = std::max<int>(&local_38,(int *)&stack0xffffffffffffffc4);
  local_30 = 1 - local_30;
  if (local_30 < 1) {
    local_30 = -local_30;
  }
  VVar1.valX_ = 0.0;
  VVar1.viol_ = (double)(*piVar4 + local_30);
  return VVar1;
}

Assistant:

Violation ComputeViolationSOS2(const VarInfo& x) const {
    int npos=0, pos1=-1, pos2=-1;
    int posDist=1;     // should be 1
    for (int i=(int)v_.size(); i--; ) {
      if (x.is_positive(v_[i])) {
        ++npos;
        if (pos1<0)
          pos1=i;
        else if (pos2<0) {
          pos2=i;
          posDist = pos1-pos2;
        }
      }
    }
    return {double(std::max(0, npos-2)
        + std::abs(1 - posDist)), 0.0};
  }